

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall pstore::stderr_logger::~stderr_logger(stderr_logger *this)

{
  (this->super_file_logger).super_basic_logger.super_logger._vptr_logger =
       (_func_int **)&PTR__basic_logger_00231640;
  std::__cxx11::string::~string
            ((string *)&(this->super_file_logger).super_basic_logger.thread_name_);
  logger::~logger((logger *)this);
  return;
}

Assistant:

stderr_logger::~stderr_logger () noexcept = default;